

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

AtomTypeSet * __thiscall OpenMD::SelectionManager::getSelectedAtomTypes(SelectionManager *this)

{
  bool bVar1;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *this_00;
  reference ppSVar2;
  long in_RSI;
  AtomTypeSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<OpenMD::AtomType_*>,_bool> pVar3;
  Atom *atom;
  size_t i;
  AtomTypeSet *atomTypes;
  int in_stack_ffffffffffffff6c;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_ffffffffffffff70;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *__x;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *local_20;
  
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x1a826e);
  local_20 = (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x0;
  while( true ) {
    __x = local_20;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RSI + 8),0
              );
    this_00 = (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
               *)OpenMDBitSet::size((OpenMDBitSet *)0x1a829b);
    if (this_00 <= __x) break;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RSI + 8),0
              );
    bVar1 = OpenMDBitSet::operator[]
                      ((OpenMDBitSet *)in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff6c);
    if ((bVar1) &&
       (ppSVar2 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 0x38),(size_type)local_20), *ppSVar2 != (value_type)0x0))
    {
      ppSVar2 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RSI + 0x38),(size_type)local_20);
      bVar1 = StuntDouble::isAtom(*ppSVar2);
      if (bVar1) {
        ppSVar2 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 0x38),(size_type)local_20);
        Atom::getAtomType((Atom *)*ppSVar2);
        pVar3 = std::
                set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                ::insert(this_00,(value_type *)__x);
        in_stack_ffffffffffffff70 = pVar3.first._M_node;
        in_stack_ffffffffffffff6c = CONCAT13(pVar3.second,(int3)in_stack_ffffffffffffff6c);
      }
    }
    local_20 = (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                *)&(local_20->_M_t)._M_impl.field_0x1;
  }
  return in_RDI;
}

Assistant:

AtomTypeSet SelectionManager::getSelectedAtomTypes() {
    AtomTypeSet atomTypes;

    for (size_t i = 0; i < ss_.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (ss_.bitsets_[STUNTDOUBLE][i]) {
        // check that this processor owns this stuntdouble
        if (stuntdoubles_[i] != NULL) {
          if (stuntdoubles_[i]->isAtom()) {
            Atom* atom = static_cast<Atom*>(stuntdoubles_[i]);
            atomTypes.insert(atom->getAtomType());
          }
        }
      }
    }

#ifdef IS_MPI
    // loop over the found atom types on this processor, and add their
    // numerical idents to a vector:

    std::vector<int> foundTypes;
    AtomTypeSet::iterator i;
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i)
      foundTypes.push_back((*i)->getIdent());

    // count_local holds the number of found types on this processor
    int count_local = foundTypes.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    std::vector<int> counts(nproc, 0);
    std::vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    if (totalCount > 0) {
      // we need a (possibly redundant) set of all found types:
      std::vector<int> ftGlobal(totalCount);

      // now spray out the foundTypes to all the other processors:
      MPI_Allgatherv(&foundTypes[0], count_local, MPI_INT, &ftGlobal[0],
                     &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

      std::vector<int>::iterator j;

      // foundIdents is a stl set, so inserting an already found ident
      // will have no effect.
      std::set<int> foundIdents;

      for (j = ftGlobal.begin(); j != ftGlobal.end(); ++j)
        foundIdents.insert((*j));

      // now iterate over the foundIdents and get the actual atom types
      // that correspond to these:
      ForceField* forceField_ = info_->getForceField();
      std::set<int>::iterator it;
      for (it = foundIdents.begin(); it != foundIdents.end(); ++it)
        atomTypes.insert(forceField_->getAtomType((*it)));
    }
#endif

    return atomTypes;
  }